

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O0

void duckdb_brotli::DecodeCommandBlockSwitch(BrotliDecoderStateInternal *s)

{
  byte bVar1;
  ushort uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  ulong *puVar7;
  long in_RDI;
  BrotliBitReaderState memento;
  uint64_t block_type;
  uint64_t *ringbuffer;
  BrotliBitReader *br;
  HuffmanCode *len_tree;
  HuffmanCode *type_tree;
  uint64_t max_block_type;
  uint64_t offset;
  uint64_t nbits_5;
  uint64_t bits;
  uint64_t index;
  uint64_t val_2;
  uint64_t val_1;
  uint64_t nbits_3;
  uint64_t nbits_4;
  uint64_t nbits;
  uint64_t nbits_1;
  uint64_t code;
  uint64_t nbits_2;
  uint64_t val;
  uint64_t bit_pos_2;
  uint32_t t_2;
  uint64_t bit_pos_1;
  uint32_t t_1;
  uint64_t bit_pos;
  uint32_t t;
  ulong local_6b8;
  byte *local_3a0;
  byte *local_320;
  
  uVar3 = *(ulong *)(in_RDI + 0x140);
  puVar7 = (ulong *)(in_RDI + 8);
  if (uVar3 < 2) {
    bVar6 = false;
  }
  else {
    uVar4 = *(ulong *)(in_RDI + 0x10);
    if (uVar4 < 0x21) {
      *puVar7 = *puVar7 | (ulong)**(uint **)(in_RDI + 0x18) << ((byte)uVar4 & 0x3f);
      *(ulong *)(in_RDI + 0x10) = uVar4 + 0x20;
      *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 4;
    }
    uVar4 = *puVar7;
    local_3a0 = (byte *)((uVar4 & 0xff) * 4 + *(long *)(in_RDI + 0x100) + 0x9e0);
    if (8 < *local_3a0) {
      bVar1 = *local_3a0;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + -8;
      *puVar7 = *puVar7 >> 8;
      local_3a0 = local_3a0 +
                  ((ulong)*(ushort *)(local_3a0 + 2) +
                  (uVar4 >> 8 & *(ulong *)(kBrotliBitMask + (ulong)(bVar1 - 8) * 8))) * 4;
    }
    bVar1 = *local_3a0;
    *(ulong *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - (ulong)bVar1;
    *puVar7 = *puVar7 >> (bVar1 & 0x3f);
    local_6b8 = (ulong)*(ushort *)(local_3a0 + 2);
    uVar4 = *(ulong *)(in_RDI + 0x10);
    if (uVar4 < 0x21) {
      *puVar7 = *puVar7 | (ulong)**(uint **)(in_RDI + 0x18) << ((byte)uVar4 & 0x3f);
      *(ulong *)(in_RDI + 0x10) = uVar4 + 0x20;
      *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 4;
    }
    uVar4 = *puVar7;
    local_320 = (byte *)((uVar4 & 0xff) * 4 + *(long *)(in_RDI + 0x108) + 0x630);
    if (8 < *local_320) {
      bVar1 = *local_320;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + -8;
      *puVar7 = *puVar7 >> 8;
      local_320 = local_320 +
                  ((ulong)*(ushort *)(local_320 + 2) +
                  (uVar4 >> 8 & *(ulong *)(kBrotliBitMask + (ulong)(bVar1 - 8) * 8))) * 4;
    }
    bVar1 = *local_320;
    *(ulong *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - (ulong)bVar1;
    *puVar7 = *puVar7 >> (bVar1 & 0x3f);
    bVar1 = _kBrotliPrefixCodeRanges[(ulong)*(ushort *)(local_320 + 2) * 4 + 2];
    uVar2 = *(ushort *)(_kBrotliPrefixCodeRanges + (ulong)*(ushort *)(local_320 + 2) * 4);
    uVar4 = *(ulong *)(in_RDI + 0x10);
    if (uVar4 < 0x21) {
      *puVar7 = *puVar7 | (ulong)**(uint **)(in_RDI + 0x18) << ((byte)uVar4 & 0x3f);
      *(ulong *)(in_RDI + 0x10) = uVar4 + 0x20;
      *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 4;
    }
    uVar4 = *puVar7;
    uVar5 = *(ulong *)(kBrotliBitMask + (ulong)bVar1 * 8);
    *(ulong *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - (ulong)bVar1;
    *puVar7 = *puVar7 >> (bVar1 & 0x3f);
    *(ulong *)(in_RDI + 0x120) = (ulong)uVar2 + (uVar4 & uVar5);
    if (local_6b8 == 1) {
      local_6b8 = *(long *)(in_RDI + 0x168) + 1;
    }
    else if (local_6b8 == 0) {
      local_6b8 = *(ulong *)(in_RDI + 0x160);
    }
    else {
      local_6b8 = local_6b8 - 2;
    }
    if (uVar3 <= local_6b8) {
      local_6b8 = local_6b8 - uVar3;
    }
    *(ulong *)(in_RDI + 0x160) = *(ulong *)(in_RDI + 0x168);
    *(ulong *)(in_RDI + 0x168) = local_6b8;
    bVar6 = true;
  }
  if (bVar6) {
    *(undefined8 *)(in_RDI + 0x98) =
         *(undefined8 *)(*(long *)(in_RDI + 0xd0) + *(long *)(in_RDI + 0x168) * 8);
  }
  return;
}

Assistant:

static void BROTLI_NOINLINE DecodeCommandBlockSwitch(BrotliDecoderState *s) {
	DecodeCommandBlockSwitchInternal(0, s);
}